

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O1

btScalar __thiscall
btClosestNotMeConvexResultCallback::addSingleResult
          (btClosestNotMeConvexResultCallback *this,LocalConvexResult *convexResult,
          bool normalInWorldSpace)

{
  btScalar bVar1;
  
  if (((convexResult->m_hitCollisionObject != this->m_me) &&
      ((convexResult->m_hitCollisionObject->m_collisionFlags & 4) == 0)) &&
     (((this->super_ClosestConvexResultCallback).m_convexToWorld.m_floats[2] -
      (this->super_ClosestConvexResultCallback).m_convexFromWorld.m_floats[2]) *
      (convexResult->m_hitNormalLocal).m_floats[2] +
      ((this->super_ClosestConvexResultCallback).m_convexToWorld.m_floats[0] -
      (this->super_ClosestConvexResultCallback).m_convexFromWorld.m_floats[0]) *
      (convexResult->m_hitNormalLocal).m_floats[0] +
      ((this->super_ClosestConvexResultCallback).m_convexToWorld.m_floats[1] -
      (this->super_ClosestConvexResultCallback).m_convexFromWorld.m_floats[1]) *
      (convexResult->m_hitNormalLocal).m_floats[1] < -this->m_allowedPenetration)) {
    bVar1 = btCollisionWorld::ClosestConvexResultCallback::addSingleResult
                      (&this->super_ClosestConvexResultCallback,convexResult,normalInWorldSpace);
    return bVar1;
  }
  return 1.0;
}

Assistant:

virtual btScalar addSingleResult(btCollisionWorld::LocalConvexResult& convexResult,bool normalInWorldSpace)
	{
		if (convexResult.m_hitCollisionObject == m_me)
			return 1.0f;

		//ignore result if there is no contact response
		if(!convexResult.m_hitCollisionObject->hasContactResponse())
			return 1.0f;

		btVector3 linVelA,linVelB;
		linVelA = m_convexToWorld-m_convexFromWorld;
		linVelB = btVector3(0,0,0);//toB.getOrigin()-fromB.getOrigin();

		btVector3 relativeVelocity = (linVelA-linVelB);
		//don't report time of impact for motion away from the contact normal (or causes minor penetration)
		if (convexResult.m_hitNormalLocal.dot(relativeVelocity)>=-m_allowedPenetration)
			return 1.f;

		return ClosestConvexResultCallback::addSingleResult (convexResult, normalInWorldSpace);
	}